

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O3

void __thiscall
ParticleTest_DefaultConstructor_Test<pica::Particle<(pica::Dimension)3>_>::TestBody
          (ParticleTest_DefaultConstructor_Test<pica::Particle<(pica::Dimension)3>_> *this)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_3;
  AssertHelper local_78;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  AssertHelper local_68;
  AssertHelperData *pAStack_60;
  AssertHelperData *local_58;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_40;
  undefined8 local_38;
  
  lVar2 = 0;
  do {
    local_38 = 0;
    local_48.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    sStack_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_58 = (AssertHelperData *)0x0;
    local_68.data_ = (AssertHelperData *)0x0;
    pAStack_60 = (AssertHelperData *)0x0;
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)&local_78,"PositionType()[d]","particle.getPosition()[d]",
               (double *)((long)&local_48.ptr_ + lVar2),(double *)((long)&local_68.data_ + lVar2));
    if (local_78.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_48);
      if (local_70.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_70.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                 ,0x1e,pcVar3);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      if (((local_48.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
         (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      return;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x18);
  lVar2 = 0;
  do {
    local_48.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    sStack_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_38 = 0;
    local_68.data_ = (AssertHelperData *)(*pica::ParticleTypes::types * 0.0);
    pAStack_60 = local_68.data_;
    local_58 = local_68.data_;
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)&local_78,"MomentumType()[d]","particle.getMomentum()[d]",
               (double *)((long)&local_48.ptr_ + lVar2),(double *)((long)&local_68.data_ + lVar2));
    if (local_78.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_48);
      if (local_70.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_70.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                 ,0x1f,pcVar3);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      if (((local_48.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
         (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      return;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x18);
  lVar2 = 0;
  do {
    local_38 = 0;
    local_48.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    sStack_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_58 = (AssertHelperData *)0x0;
    local_68.data_ = (AssertHelperData *)0x0;
    pAStack_60 = (AssertHelperData *)0x0;
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)&local_78,"MomentumType()[d]","particle.getVelocity()[d]",
               (double *)((long)&local_48.ptr_ + lVar2),(double *)((long)&local_68.data_ + lVar2));
    if (local_78.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_48);
      if (local_70.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_70.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                 ,0x20,pcVar3);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      if (((local_48.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
         (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      return;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x18);
  local_68.data_ = (AssertHelperData *)&DAT_3ff0000000000000;
  local_78.data_ = (AssertHelperData *)&DAT_3ff0000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&local_48,"static_cast<FactorType>(1.0)","particle.getFactor()",
             (double *)&local_68,(double *)&local_78);
  if (local_48.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (sStack_40.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((sStack_40.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
               ,0x21,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (((local_68.data_ != (AssertHelperData *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (local_68.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_68.data_ + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&sStack_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&sStack_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_68.data_ = (AssertHelperData *)&DAT_3ff0000000000000;
    local_78.data_ = (AssertHelperData *)&DAT_3ff0000000000000;
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)&local_48,"static_cast<GammaType>(1.0)","particle.getGamma()",
               (double *)&local_68,(double *)&local_78);
    if (local_48.ptr_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_68);
      if (sStack_40.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((sStack_40.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                 ,0x22,pcVar3);
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if (((local_68.data_ != (AssertHelperData *)0x0) &&
          (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
         (local_68.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_68.data_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&sStack_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  return;
}

Assistant:

TYPED_TEST(ParticleTest, DefaultConstructor)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::PositionType PositionType;
    typedef typename ParticleTest<TypeParam>::MomentumType MomentumType;
    typedef typename ParticleTest<TypeParam>::GammaType GammaType;
    typedef typename ParticleTest<TypeParam>::FactorType FactorType;

    ParticleType particle;
    ASSERT_EQ_VECTOR(PositionType(), particle.getPosition(), this->dimension);
    ASSERT_EQ_VECTOR(MomentumType(), particle.getMomentum(), this->momentumDimension);
    ASSERT_EQ_VECTOR(MomentumType(), particle.getVelocity(), this->momentumDimension);
    ASSERT_EQ(static_cast<FactorType>(1.0), particle.getFactor());
    ASSERT_EQ(static_cast<GammaType>(1.0), particle.getGamma());
}